

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  double dVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  GCObject *extraout_RAX;
  GCObject *extraout_RAX_00;
  GCObject *pGVar5;
  TValue *f;
  Table *pTVar6;
  bool bVar7;
  double dVar8;
  
  bVar2 = t1->tt_;
  pGVar5 = (GCObject *)(ulong)bVar2;
  bVar3 = t2->tt_;
  if ((bVar2 & 0x3f) != (bVar3 & 0x3f)) {
    if ((bVar3 & 0xf) != 3 || (bVar2 & 0xf) != 3) {
      return 0;
    }
    if (bVar2 == 3) {
      t1 = (TValue *)(t1->value_).gc;
      bVar7 = false;
    }
    else {
      bVar7 = true;
      if (bVar2 == 0x13) {
        dVar1 = (t1->value_).n;
        dVar8 = floor(dVar1);
        pGVar5 = extraout_RAX;
        if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
          bVar7 = 9.223372036854776e+18 <= dVar8 || dVar8 < -9.223372036854776e+18;
          t1 = (TValue *)(long)dVar8;
        }
      }
    }
    if (bVar7) {
      return 0;
    }
    if (bVar3 == 3) {
      pGVar5 = (t2->value_).gc;
      bVar7 = false;
    }
    else {
      bVar7 = true;
      if (bVar3 == 0x13) {
        dVar1 = (t2->value_).n;
        dVar8 = floor(dVar1);
        pGVar5 = extraout_RAX_00;
        if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
          bVar7 = dVar8 < -9.223372036854776e+18 || 9.223372036854776e+18 <= dVar8;
          pGVar5 = (GCObject *)(long)dVar8;
        }
      }
    }
    if (bVar7) {
      return 0;
    }
    bVar7 = (GCObject *)t1 == pGVar5;
LAB_00152e6d:
    return (uint)bVar7;
  }
  iVar4 = 1;
  switch(bVar2 & 0x3f) {
  case 0:
  case 1:
  case 0x11:
    goto switchD_00152caf_caseD_0;
  default:
    bVar7 = (t1->value_).gc == (t2->value_).gc;
    goto LAB_00152e6d;
  case 5:
    if ((GCObject *)(t1->value_).f == (t2->value_).gc) {
      return 1;
    }
    if (L != (lua_State *)0x0) {
      pTVar6 = *(Table **)&((GCObject *)(t1->value_).f)[2].tt;
      if ((pTVar6 == (Table *)0x0) || ((pTVar6->flags & 0x20) != 0)) {
        f = (TValue *)0x0;
      }
      else {
        f = luaT_gettm(pTVar6,TM_EQ,L->l_G->tmname[5]);
      }
      if (f == (TValue *)0x0) {
        pTVar6 = *(Table **)((t2->value_).f + 0x28);
LAB_00152e9f:
        if ((pTVar6 == (Table *)0x0) || ((pTVar6->flags & 0x20) != 0)) {
          f = (TValue *)0x0;
        }
        else {
          f = luaT_gettm(pTVar6,TM_EQ,L->l_G->tmname[5]);
        }
      }
LAB_00152ec7:
      if (f != (TValue *)0x0) {
        luaT_callTMres(L,f,t1,t2,(L->top).p);
        bVar2 = *(byte *)((L->top).offset + 8);
        return (uint)((bVar2 & 0xf) != 0 && bVar2 != 1);
      }
    }
    break;
  case 7:
    if ((GCObject *)(t1->value_).f == (t2->value_).gc) {
      return 1;
    }
    if (L != (lua_State *)0x0) {
      pTVar6 = *(Table **)&((GCObject *)(t1->value_).f)[1].tt;
      if ((pTVar6 == (Table *)0x0) || ((pTVar6->flags & 0x20) != 0)) {
        f = (TValue *)0x0;
      }
      else {
        f = luaT_gettm(pTVar6,TM_EQ,L->l_G->tmname[5]);
      }
      if (f == (TValue *)0x0) {
        pTVar6 = *(Table **)((t2->value_).f + 0x18);
        goto LAB_00152e9f;
      }
      goto LAB_00152ec7;
    }
    break;
  case 0x13:
    return -(uint)((t2->value_).n == (t1->value_).n) & 1;
  case 0x14:
    iVar4 = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
    return iVar4;
  }
  iVar4 = 0;
switchD_00152caf_caseD_0:
  return iVar4;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttypetag(t1) != ttypetag(t2)) {  /* not the same variant? */
    if (ttype(t1) != ttype(t2) || ttype(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      /* One of them is an integer. If the other does not have an
         integer value, they cannot be equal; otherwise, compare their
         integer values. */
      lua_Integer i1, i2;
      return (luaV_tointegerns(t1, &i1, F2Ieq) &&
              luaV_tointegerns(t2, &i2, F2Ieq) &&
              i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttypetag(t1)) {
    case LUA_VNIL: case LUA_VFALSE: case LUA_VTRUE: return 1;
    case LUA_VNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_VNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_VLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_VLCF: return fvalue(t1) == fvalue(t2);
    case LUA_VSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_VLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_VUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case LUA_VTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  else {
    luaT_callTMres(L, tm, t1, t2, L->top.p);  /* call TM */
    return !l_isfalse(s2v(L->top.p));
  }
}